

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall ThreadTrackerItem::~ThreadTrackerItem(ThreadTrackerItem *this)

{
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x1074dc);
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ThreadTrackerItem()
        : numStacks(0),
          aggrStackNameRaw(4096),
          lenName(0)
        {}